

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O2

void __thiscall ValueHashTable<ExprHash,_Value_*>::Init(ValueHashTable<ExprHash,_Value_*> *this)

{
  uint uVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  
  this->table = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                (this + 1);
  uVar1 = this->tableSize;
  lVar2 = 8;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    puVar4 = (undefined4 *)
             ((long)&(this->table->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar2);
    puVar5 = puVar4 + -2;
    *(undefined4 **)puVar5 = puVar5;
    *puVar4 = 0;
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void Init()
    {
        table = (SListBase<HashBucket> *)(((char *)this) + sizeof(ValueHashTable));
        for (uint i = 0; i < tableSize; i++)
        {
            // placement new
            ::new (&table[i]) SListBase<HashBucket>();
        }
    }